

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddLinkLibrary(cmTarget *this,cmMakefile *mf,string *lib,cmTargetLinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  size_t __n;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  cmTarget *pcVar7;
  long *plVar8;
  size_type sVar9;
  cmValue cVar10;
  size_type *psVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string libName;
  string dependencies;
  cmTargetLinkLibraryType local_cc;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  undefined8 local_80;
  string local_78;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  _Storage<cmListFileBacktrace,_false> local_48;
  char local_38;
  
  bVar4 = false;
  local_cc = llt;
  pcVar7 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (pcVar7 != (cmTarget *)0x0) {
    bVar4 = cmTargetInternals::IsImported
                      ((pcVar7->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
    bVar4 = !bVar4;
  }
  if ((bVar4) && (local_cc != GENERAL_LibraryType)) {
    std::operator+(&local_a8,"$<TARGET_NAME:",lib);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8.field_2._8_8_ = plVar8[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_c8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar2 = (lib->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + lib->_M_string_length);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"LINK_LIBRARIES","");
  GetDebugGeneratorExpressions(&local_78,this,&local_c8,local_cc);
  cmMakefile::GetBacktrace(mf);
  local_48._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_58;
  local_48._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = '\x01';
  AppendProperty(this,&local_a8,&local_78,(optional<cmListFileBacktrace> *)&local_48._M_value,false)
  ;
  if ((local_38 == '\x01') &&
     (local_38 = '\0',
     local_48._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  sVar9 = cmGeneratorExpression::Find(lib);
  if (sVar9 != 0xffffffffffffffff) {
    return;
  }
  if (pcVar7 != (cmTarget *)0x0) {
    iVar5 = ((pcVar7->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
    if (iVar5 == 4) {
      return;
    }
    if (iVar5 == 7) {
      return;
    }
  }
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __n = *(size_type *)((long)&(_Var3._M_head_impl)->Name + 8);
  if (__n == lib->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar5 = bcmp(((_Var3._M_head_impl)->Name)._M_dataplus._M_p,(lib->_M_dataplus)._M_p,__n);
    if (iVar5 == 0) {
      return;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
  ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
            ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
              *)&(_Var3._M_head_impl)->OriginalLinkLibraries,lib,&local_cc);
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var3._M_head_impl)->TargetType - 1 < 3) {
    PVar6 = cmPolicies::PolicyMap::Get(&(_Var3._M_head_impl)->PolicyMap,CMP0073);
    if ((PVar6 != OLD) &&
       (PVar6 = cmPolicies::PolicyMap::Get
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            PolicyMap,CMP0073), PVar6 != WARN)) {
      return;
    }
    _Var3._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    local_a8._M_string_length = *(size_type *)&((_Var3._M_head_impl)->Name)._M_dataplus;
    local_a8._M_dataplus._M_p = *(pointer *)((long)&(_Var3._M_head_impl)->Name + 8);
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = 0xc;
    local_88 = "_LIB_DEPENDS";
    local_80 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_a8;
    cmCatViews(&local_c8,views);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity =
         local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cVar10 = cmMakefile::GetDefinition(mf,&local_c8);
    if (cVar10.Value != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)((cVar10.Value)->_M_dataplus)._M_p);
    }
    if (local_cc < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(lib->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Dependencies for the target","");
    cmMakefile::AddCacheDefinition(mf,&local_c8,&local_a8,&local_78,STATIC,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
    this->AppendProperty("LINK_LIBRARIES",
                         this->GetDebugGeneratorExpressions(libName, llt),
                         mf.GetBacktrace());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->impl->Name == lib)) {
    return;
  }

  this->impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      this->impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = cmStrCat(this->impl->Name, "_LIB_DEPENDS");
    std::string dependencies;
    cmValue old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += *old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies,
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}